

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_handle.cpp
# Opt level: O2

unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> __thiscall
duckdb::CSVFileHandle::OpenFileHandle
          (CSVFileHandle *this,FileSystem *fs,Allocator *allocator,OpenFileInfo *file,
          FileCompressionType compression)

{
  bool bVar1;
  idx_t iVar2;
  pointer pFVar3;
  undefined7 in_register_00000081;
  optional_ptr<duckdb::FileOpener,_true> opener;
  FileOpenFlags FVar4;
  
  FVar4 = FileOpenFlags::operator|
                    ((FileOpenFlags *)FileFlags::FILE_FLAGS_READ,
                     (FileOpenFlags)
                     (ZEXT416((uint)((int)CONCAT71(in_register_00000081,compression) << 8)) << 0x40)
                    );
  iVar2 = FVar4.flags;
  opener.ptr._2_6_ = 0;
  opener.ptr._0_2_ = FVar4._8_2_;
  FVar4.lock = (char)iVar2;
  FVar4.compression = (char)(iVar2 >> 8);
  FVar4._10_6_ = (int6)(iVar2 >> 0x10);
  FVar4.flags = (idx_t)file;
  FileSystem::OpenFile((FileSystem *)this,(OpenFileInfo *)fs,FVar4,opener);
  pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                       *)this);
  bVar1 = FileHandle::CanSeek(pFVar3);
  if (bVar1) {
    pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator->((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                         *)this);
    FileHandle::Reset(pFVar3);
  }
  return (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)
         (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)this;
}

Assistant:

unique_ptr<FileHandle> CSVFileHandle::OpenFileHandle(FileSystem &fs, Allocator &allocator, const OpenFileInfo &file,
                                                     FileCompressionType compression) {
	auto file_handle = fs.OpenFile(file, FileFlags::FILE_FLAGS_READ | compression);
	if (file_handle->CanSeek()) {
		file_handle->Reset();
	}
	return file_handle;
}